

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KryoFlux.cpp
# Opt level: O0

FluxData *
KryoFlux::DecodeStream
          (FluxData *__return_storage_ptr__,Data *data,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *warnings)

{
  pointer *this;
  byte bVar1;
  bool bVar2;
  int iVar3;
  byte *pbVar4;
  reference puVar5;
  reference pbVar6;
  ulong uVar7;
  char *__nptr;
  reference puVar8;
  reference pvVar9;
  size_type sVar10;
  allocator<char> local_351;
  value_type local_350;
  allocator<unsigned_int> local_329;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_328;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_320;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_318;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_310;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_308;
  uint local_2ec;
  iterator iStack_2e8;
  uint index_offset;
  iterator __end1;
  iterator __begin1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range1;
  uint32_t last_pos;
  string local_2a8;
  undefined1 local_288 [8];
  string value;
  undefined1 local_248 [8];
  string name;
  size_type pos;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *entry;
  iterator __end5;
  iterator __begin5;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range5;
  undefined1 local_1e0 [8];
  string info;
  allocator<char> local_199;
  value_type local_198;
  allocator<char> local_171;
  value_type local_170;
  uint local_14c;
  reference puStack_148;
  uint eof_ret;
  uint32_t *pdw_1;
  uint *local_138;
  uint32_t *pdw;
  value_type local_128;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_108;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_100;
  ushort local_f2;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  _Stack_f0;
  uint16_t size;
  byte local_e1;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  _Stack_e0;
  uchar subtype;
  uchar *local_d8;
  uint local_cc;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_c8;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_c0;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_b8;
  byte local_a9;
  const_iterator cStack_a8;
  uchar type;
  const_iterator itEnd;
  const_iterator it;
  const_iterator itBegin;
  undefined1 local_88 [4];
  int hard_indexes;
  vector<unsigned_int,_std::allocator<unsigned_int>_> index_offsets;
  uint32_t ps_per_tick;
  uint32_t stream_pos;
  uint32_t time;
  undefined1 local_58 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> flux_counts;
  vector<unsigned_int,_std::allocator<unsigned_int>_> flux_times;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *warnings_local;
  Data *data_local;
  FluxData *flux_revs;
  
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::vector(__return_storage_ptr__);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             &flux_counts.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_58);
  iVar3 = Data::size(data);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             &flux_counts.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,(long)iVar3);
  iVar3 = Data::size(data);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_58,(long)iVar3);
  ps_per_tick = 0;
  index_offsets.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  index_offsets.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_4_ = 0xa293;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_88);
  itBegin._M_current._4_4_ = 0;
  itEnd = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                    (&data->super_vector<unsigned_char,_std::allocator<unsigned_char>_>);
  cStack_a8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                        (&data->super_vector<unsigned_char,_std::allocator<unsigned_char>_>);
  do {
    bVar2 = __gnu_cxx::operator!=(&itEnd,&stack0xffffffffffffff58);
    if (!bVar2) {
      __range1._0_4_ = 0;
      __end1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_88);
      iStack_2e8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                             ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_88);
      while (bVar2 = __gnu_cxx::operator!=(&__end1,&stack0xfffffffffffffd18), bVar2) {
        puVar8 = __gnu_cxx::
                 __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                 ::operator*(&__end1);
        local_2ec = *puVar8;
        if ((value_type)__range1 != 0) {
          while( true ) {
            bVar2 = false;
            if (local_2ec != 0) {
              pvVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                 ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_58,
                                  (ulong)local_2ec);
              bVar2 = *pvVar9 == 0;
            }
            if (!bVar2) break;
            local_2ec = local_2ec - 1;
          }
          this = &flux_counts.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage;
          local_318._M_current =
               (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                                 ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this);
          local_310 = __gnu_cxx::
                      __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                      ::operator+(&local_318,(ulong)(value_type)__range1);
          local_328._M_current =
               (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                                 ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this);
          pvVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                             ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_58,
                              (ulong)local_2ec);
          local_320 = __gnu_cxx::
                      __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                      ::operator+(&local_328,(ulong)*pvVar9);
          std::allocator<unsigned_int>::allocator(&local_329);
          std::vector<unsigned_int,std::allocator<unsigned_int>>::
          vector<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,void>
                    ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_308,local_310,
                     local_320,&local_329);
          std::
          vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
          ::emplace_back<std::vector<unsigned_int,std::allocator<unsigned_int>>>
                    ((vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                      *)__return_storage_ptr__,&local_308);
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_308);
          std::allocator<unsigned_int>::~allocator(&local_329);
        }
        pvVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_58,
                            (ulong)local_2ec);
        __range1._0_4_ = *pvVar9;
        __gnu_cxx::
        __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
        ::operator++(&__end1);
      }
      sVar10 = std::
               vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               ::size(__return_storage_ptr__);
      if (sVar10 == 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_350,"no flux data",&local_351);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(warnings,&local_350);
        std::__cxx11::string::~string((string *)&local_350);
        std::allocator<char>::~allocator(&local_351);
      }
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_88);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_58);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 &flux_counts.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage);
      return __return_storage_ptr__;
    }
    sVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                        &flux_counts.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
    pvVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_58,
                        (ulong)index_offsets.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
    *pvVar9 = (value_type)sVar10;
    local_b8 = __gnu_cxx::
               __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
               ::operator++(&itEnd,0);
    pbVar4 = __gnu_cxx::
             __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             ::operator*(&local_b8);
    local_a9 = *pbVar4;
    switch(local_a9) {
    case 10:
      local_d8 = (uchar *)__gnu_cxx::
                          __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                          ::operator++(&itEnd,0);
      index_offsets.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ =
           index_offsets.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage._4_4_ + 1;
    case 9:
      _Stack_e0 = __gnu_cxx::
                  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  ::operator++(&itEnd,0);
      index_offsets.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ =
           index_offsets.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage._4_4_ + 1;
    case 8:
      index_offsets.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ =
           index_offsets.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage._4_4_ + 1;
      break;
    case 0xb:
      ps_per_tick = ps_per_tick + 0x10000;
      index_offsets.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ =
           index_offsets.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage._4_4_ + 1;
      break;
    case 0xc:
      local_c0 = __gnu_cxx::
                 __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                 ::operator++(&itEnd,0);
      pbVar4 = __gnu_cxx::
               __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
               ::operator*(&local_c0);
      local_a9 = *pbVar4;
      index_offsets.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ =
           index_offsets.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage._4_4_ + 1;
    case 0:
    case 1:
    case 2:
    case 3:
    case 4:
    case 5:
    case 6:
    case 7:
      bVar1 = local_a9;
      local_c8 = __gnu_cxx::
                 __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                 ::operator++(&itEnd,0);
      puVar5 = __gnu_cxx::
               __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
               ::operator*(&local_c8);
      local_cc = ((ps_per_tick + CONCAT11(bVar1,*puVar5)) *
                 (int)index_offsets.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage) / 1000;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 &flux_counts.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage,&local_cc);
      index_offsets.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ =
           index_offsets.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage._4_4_ + 2;
      ps_per_tick = 0;
      break;
    case 0xd:
      _Stack_f0 = __gnu_cxx::
                  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  ::operator++(&itEnd,0);
      pbVar4 = __gnu_cxx::
               __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
               ::operator*(&stack0xffffffffffffff10);
      local_e1 = *pbVar4;
      local_100 = __gnu_cxx::
                  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  ::operator++(&itEnd,0);
      pbVar4 = __gnu_cxx::
               __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
               ::operator*(&local_100);
      local_f2 = (ushort)*pbVar4;
      local_108 = __gnu_cxx::
                  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  ::operator++(&itEnd,0);
      pbVar4 = __gnu_cxx::
               __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
               ::operator*(&local_108);
      local_f2 = local_f2 | (ushort)*pbVar4 << 8;
      switch(local_e1) {
      case 0:
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_128,"invalid OOB detected",(allocator<char> *)((long)&pdw + 7));
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(warnings,&local_128);
        std::__cxx11::string::~string((string *)&local_128);
        std::allocator<char>::~allocator((allocator<char> *)((long)&pdw + 7));
        itEnd._M_current = cStack_a8._M_current;
        break;
      case 1:
        if (local_f2 != 8) {
          __assert_fail("size == 8",
                        "/workspace/llm4binary/github/license_c_cmakelists/simonowen[P]samdisk/src/KryoFlux.cpp"
                        ,0x10d,
                        "static FluxData KryoFlux::DecodeStream(const Data &, std::vector<std::string> &)"
                       );
        }
        break;
      case 2:
        if (local_f2 != 0xc) {
          __assert_fail("size == 12",
                        "/workspace/llm4binary/github/license_c_cmakelists/simonowen[P]samdisk/src/KryoFlux.cpp"
                        ,0x112,
                        "static FluxData KryoFlux::DecodeStream(const Data &, std::vector<std::string> &)"
                       );
        }
        if ((opt.hardsectors < 2) ||
           (itBegin._M_current._4_4_ = itBegin._M_current._4_4_ + 1,
           itBegin._M_current._4_4_ % opt.hardsectors == 0)) {
          local_138 = (uint *)__gnu_cxx::
                              __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                              ::operator*(&itEnd);
          pdw_1._4_4_ = util::letoh<unsigned_int>(*local_138);
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_88,
                     (value_type_conflict2 *)((long)&pdw_1 + 4));
        }
        break;
      case 3:
        if (local_f2 != 8) {
          __assert_fail("size == 8",
                        "/workspace/llm4binary/github/license_c_cmakelists/simonowen[P]samdisk/src/KryoFlux.cpp"
                        ,0x120,
                        "static FluxData KryoFlux::DecodeStream(const Data &, std::vector<std::string> &)"
                       );
        }
        puStack_148 = __gnu_cxx::
                      __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      ::operator*(&itEnd);
        local_14c = util::letoh<unsigned_int>(*(uint *)(puStack_148 + 4));
        if (local_14c == 1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_170,"stream end (buffering problem)",&local_171);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(warnings,&local_170);
          std::__cxx11::string::~string((string *)&local_170);
          std::allocator<char>::~allocator(&local_171);
        }
        else if (local_14c == 2) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_198,"stream end (no index detected)",&local_199);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(warnings,&local_198);
          std::__cxx11::string::~string((string *)&local_198);
          std::allocator<char>::~allocator(&local_199);
        }
        else if (local_14c != 0) {
          util::fmt_abi_cxx11_
                    ((string *)((long)&info.field_2 + 8),"stream end problem (%u)",(ulong)local_14c)
          ;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(warnings,(value_type *)((long)&info.field_2 + 8));
          std::__cxx11::string::~string((string *)(info.field_2._M_local_buf + 8));
        }
        break;
      case 4:
        puVar5 = __gnu_cxx::
                 __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                 ::operator*(&itEnd);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_1e0,(char *)puVar5,(allocator<char> *)((long)&__range5 + 7));
        std::allocator<char>::~allocator((allocator<char> *)((long)&__range5 + 7));
        util::split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&__begin5,(string *)local_1e0,',',false);
        __end5 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&__begin5);
        entry = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&__begin5);
        while (bVar2 = __gnu_cxx::operator!=
                                 (&__end5,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                           *)&entry), bVar2) {
          pbVar6 = __gnu_cxx::
                   __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator*(&__end5);
          name.field_2._8_8_ = std::__cxx11::string::find((char)pbVar6,0x3d);
          if (name.field_2._8_8_ != -1) {
            std::__cxx11::string::substr((ulong)((long)&value.field_2 + 8),(ulong)pbVar6);
            util::trim((string *)local_248,(string *)((long)&value.field_2 + 8));
            std::__cxx11::string::~string((string *)(value.field_2._M_local_buf + 8));
            std::__cxx11::string::substr((ulong)&local_2a8,(ulong)pbVar6);
            util::trim((string *)local_288,&local_2a8);
            std::__cxx11::string::~string((string *)&local_2a8);
            uVar7 = std::__cxx11::string::empty();
            if ((((uVar7 & 1) == 0) && (uVar7 = std::__cxx11::string::empty(), (uVar7 & 1) == 0)) &&
               (bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)local_248,"sck"), bVar2)) {
              __nptr = (char *)std::__cxx11::string::c_str();
              iVar3 = atoi(__nptr);
              index_offsets.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage._0_4_ =
                   (int)(1000000000 / (long)(iVar3 / 1000));
            }
            std::__cxx11::string::~string((string *)local_288);
            std::__cxx11::string::~string((string *)local_248);
          }
          __gnu_cxx::
          __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator++(&__end5);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&__begin5);
        std::__cxx11::string::~string((string *)local_1e0);
        break;
      default:
        util::fmt_abi_cxx11_((string *)&last_pos,"unexpected OOB sub-type (%X)",(ulong)local_e1);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(warnings,(value_type *)&last_pos);
        std::__cxx11::string::~string((string *)&last_pos);
        itEnd._M_current = cStack_a8._M_current;
        break;
      case 0xd:
        if (local_f2 != 0xd0d) {
          __assert_fail("size == 0x0d0d",
                        "/workspace/llm4binary/github/license_c_cmakelists/simonowen[P]samdisk/src/KryoFlux.cpp"
                        ,0x147,
                        "static FluxData KryoFlux::DecodeStream(const Data &, std::vector<std::string> &)"
                       );
        }
        local_f2 = 0;
        itEnd._M_current = cStack_a8._M_current;
      }
      __gnu_cxx::
      __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::operator+=(&itEnd,(ulong)local_f2);
      break;
    default:
      __range1._4_4_ =
           ((ps_per_tick + local_a9) *
           (int)index_offsets.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage) / 1000;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 &flux_counts.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage,
                 (value_type_conflict2 *)((long)&__range1 + 4));
      index_offsets.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ =
           index_offsets.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage._4_4_ + 1;
      ps_per_tick = 0;
    }
  } while( true );
}

Assistant:

FluxData KryoFlux::DecodeStream(const Data& data, std::vector<std::string>& warnings)
{
    FluxData flux_revs;
    std::vector<uint32_t> flux_times, flux_counts;
    flux_times.reserve(data.size());
    flux_counts.resize(data.size());

    uint32_t time = 0, stream_pos = 0;
    uint32_t ps_per_tick = PS_PER_TICK(SAMPLE_FREQ);
    std::vector<uint32_t> index_offsets;
    int hard_indexes = 0;

    auto itBegin = data.begin(), it = itBegin, itEnd = data.end();
    while (it != itEnd)
    {
        // Store current flux count at each stream position
        flux_counts[stream_pos] = static_cast<int>(flux_times.size());

        auto type = *it++;
        switch (type)
        {
        case 0x0c: // Flux3
            type = *it++;
            stream_pos++;
        case 0x00: case 0x01: case 0x02: case 0x03: // Flux 2
        case 0x04: case 0x05: case 0x06: case 0x07:
            time += (static_cast<uint32_t>(type) << 8) | *it++;
            flux_times.push_back(time * ps_per_tick / 1000);
            stream_pos += 2;
            time = 0;
            break;
        case 0xa:   // Nop3
            it++;
            stream_pos++;
        case 0x9:   // Nop2
            it++;
            stream_pos++;
        case 0x8:   // Nop1
            stream_pos++;
            break;
        case 0xb:   // Ovl16
            time += 0x10000;
            stream_pos++;
            break;

        case OOB:   // OOB
        {
            auto subtype = *it++;
            uint16_t size = *it++;
            size |= (*it++ << 8);

            switch (subtype)
            {
            case 0x00:  // Invalid
                warnings.push_back("invalid OOB detected");
                it = itEnd;
                break;

            case 0x01:  // StreamInfo
                assert(size == 8);
                break;

            case 0x02:  // Index
            {
                assert(size == 12);

                // Soft-sectored disks have a single start-of-track index.
                // Hard-sectors are combined to achieve the same result.
                if (opt.hardsectors <= 1 || !(++hard_indexes % opt.hardsectors))
                {
                    auto pdw = reinterpret_cast<const uint32_t*>(&*it);
                    index_offsets.push_back(util::letoh(pdw[0]));
                }
                break;
            }

            case 0x03:  // StreamEnd
            {
                assert(size == 8);

                auto pdw = reinterpret_cast<const uint32_t*>(&*it);
                //                      auto eof_pos = util::letoh(pdw[0]);
                auto eof_ret = util::letoh(pdw[1]);

                if (eof_ret == 1)
                    warnings.push_back("stream end (buffering problem)");
                else if (eof_ret == 2)
                    warnings.push_back("stream end (no index detected)");
                else if (eof_ret != 0)
                    warnings.push_back(util::fmt("stream end problem (%u)", eof_ret));
                break;
            }

            case 0x04:  // KFInfo
            {
                std::string info = reinterpret_cast<const char*>(&*it);
                for (auto& entry : util::split(info, ','))
                {
                    auto pos = entry.find('=');
                    if (pos != entry.npos)
                    {
                        auto name = util::trim(entry.substr(0, pos));
                        auto value = util::trim(entry.substr(pos + 1));

                        if (!name.empty() && !value.empty())
                        {
                            //                                  disk.metadata[name] = value;

                            if (name == "sck")
                                ps_per_tick = PS_PER_TICK(std::atoi(value.c_str()));
                        }
                    }
                }
                break;
            }

            case 0x0d:  // EOF
                assert(size == 0x0d0d);     // documented value
                size = 0;                   // size is fake, so clear it
                it = itEnd;                 // advance to end
                break;

            default:
                warnings.push_back(util::fmt("unexpected OOB sub-type (%X)", subtype));
                it = itEnd;
                break;
            }

            it += size;
            break;
        }

        default:    // Flux1
            time += type;
            flux_times.push_back(time * ps_per_tick / 1000);
            stream_pos++;
            time = 0;
            break;
        }
    }

    uint32_t last_pos = 0;
    for (auto index_offset : index_offsets)
    {
        // Ignore first partial track
        if (last_pos != 0)
        {
            // Find the most recent flux count.
            while (index_offset && !flux_counts[index_offset])
                --index_offset;

            // Extract flux segment for current revolution
            flux_revs.emplace_back(std::vector<uint32_t>(
                flux_times.begin() + last_pos,
                flux_times.begin() + flux_counts[index_offset]));
        }

        last_pos = flux_counts[index_offset];
    }

    if (flux_revs.size() == 0)
        warnings.push_back("no flux data");

    return flux_revs;
}